

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O3

void __thiscall
syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_NE_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_NE_Test *this)

{
  return;
}

Assistant:

TEST(GTestSyntaxTest, NE)
{
    if( int x = 1 )
        ASSERT_NE(0, x) << x;
    if( int x = 1 )
        EXPECT_NE(0, x) << x;
    if( int x = 1 )
        INFORM_NE(0, x) << x;
    if( int x = 1 )
        ASSUME_NE(0, x) << x;
}